

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_>::on_num
          (int_writer<unsigned_long_long,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  ulong uVar1;
  long lVar2;
  num_writer f;
  wchar_t wVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  string_view prefix;
  
  uVar1 = this->abs_value;
  uVar4 = uVar1 | 1;
  lVar2 = 0x3f;
  if (uVar4 != 0) {
    for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar5 = ((uint)lVar2 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  wVar3 = internal::thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
  iVar6 = uVar5 - (uVar1 < (ulong)(&internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64)[uVar5]);
  iVar6 = iVar6 + iVar6 / 3 + 1;
  f.sep = wVar3;
  f.size = iVar6;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
  ::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
              *)this->writer,iVar6,prefix,this->spec,f);
  return;
}

Assistant:

void on_num() {
      int num_digits = internal::count_digits(abs_value);
      char_type sep = internal::thousands_sep<char_type>(writer.locale_);
      int size = num_digits + SEP_SIZE * ((num_digits - 1) / 3);
      writer.write_int(size, get_prefix(), spec,
                       num_writer{abs_value, size, sep});
    }